

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  sqlite3 *psVar1;
  Schema *pSVar2;
  char *pcVar3;
  int iVar4;
  HashElem *pHVar5;
  Vdbe *p;
  Schema **ppSVar6;
  char *zArg1;
  int iVar7;
  
  psVar1 = pParse->db;
  if (pTrigger->pSchema == (Schema *)0x0) {
    iVar7 = -0x8000;
  }
  else {
    iVar7 = -1;
    ppSVar6 = &psVar1->aDb->pSchema;
    do {
      iVar7 = iVar7 + 1;
      pSVar2 = *ppSVar6;
      ppSVar6 = ppSVar6 + 4;
    } while (pSVar2 != pTrigger->pSchema);
  }
  pHVar5 = findElementWithHash(&pTrigger->pTabSchema->tblHash,pTrigger->table,(uint *)0x0);
  if ((undefined8 *)pHVar5->data != (undefined8 *)0x0) {
    pcVar3 = psVar1->aDb[iVar7].zDbSName;
    iVar4 = sqlite3AuthCheck(pParse,(uint)(iVar7 != 1) * 2 + 0xe,pTrigger->zName,*pHVar5->data,
                             pcVar3);
    if (iVar4 != 0) {
      return;
    }
    zArg1 = "sqlite_master";
    if (iVar7 == 1) {
      zArg1 = "sqlite_temp_master";
    }
    iVar4 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,pcVar3);
    if (iVar4 != 0) {
      return;
    }
  }
  p = sqlite3GetVdbe(pParse);
  if (p == (Vdbe *)0x0) {
    return;
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_master WHERE name=%Q AND type=\'trigger\'",
                     psVar1->aDb[iVar7].zDbSName,pTrigger->zName);
  sqlite3VdbeAddOp3(pParse->pVdbe,100,iVar7,1,(pParse->db->aDb[iVar7].pSchema)->schema_cookie + 1);
  pcVar3 = pTrigger->zName;
  iVar7 = sqlite3VdbeAddOp3(p,0x99,iVar7,0,0);
  sqlite3VdbeChangeP4(p,iVar7,pcVar3,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( (pTable && pTable->pSchema==pTrigger->pSchema) || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( pTable ){
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q." LEGACY_SCHEMA_TABLE " WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}